

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::x86::EmitHelper::emitEpilog(EmitHelper *this,FuncFrame *frame)

{
  bool bVar1;
  Error EVar2;
  int iVar3;
  FuncAttributes *in_RSI;
  long in_RDI;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Mem saMem;
  Error _err_5;
  Error _err_4;
  int32_t count;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  uint32_t xSize;
  uint32_t xInst;
  Reg xReg;
  BitWordIterator<unsigned_int> it;
  RegGroup group;
  Iterator __end3;
  Iterator __begin3;
  EnumValues<asmjit::v1_14::RegGroup,_(asmjit::v1_14::RegGroup)1,_(asmjit::v1_14::RegGroup)3>
  *__range3;
  Mem xBase;
  Gp gpReg;
  Gp zbp;
  Gp zsp;
  uint32_t gpSaved;
  uint32_t registerSize;
  uint32_t regId;
  uint32_t i;
  Emitter *emitter;
  undefined4 in_stack_fffffffffffff878;
  InstId in_stack_fffffffffffff87c;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  undefined4 in_stack_fffffffffffff888;
  InstId in_stack_fffffffffffff88c;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  uint32_t *in_stack_fffffffffffff8b0;
  Reg *in_stack_fffffffffffff8b8;
  FuncFrame *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8cc;
  int local_718;
  undefined4 local_710;
  uint32_t local_70c;
  undefined4 local_708;
  undefined4 local_704;
  RegMask local_700;
  char local_6fc;
  char local_6fb;
  char local_6fa;
  undefined1 local_6f9;
  undefined1 *local_6f8;
  uint local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  FuncAttributes local_6e0;
  undefined4 local_6dc;
  EmitterExplicitT<asmjit::v1_14::x86::Emitter> local_6d8 [4];
  int local_6d4;
  uint local_6c8 [4];
  uint local_6b8;
  undefined4 local_6b4;
  RegMask local_6a8;
  int local_6a4;
  int local_6a0;
  uint local_69c;
  long local_698;
  FuncAttributes *local_690;
  Error local_67c;
  long local_678;
  undefined4 local_66c;
  long local_668;
  FuncAttributes *local_660;
  FuncAttributes *local_658;
  FuncAttributes *local_650;
  undefined4 *local_648;
  RegMask local_63c;
  RegMask *local_638;
  RegMask *local_630;
  RegMask *local_628;
  int local_61c;
  EmitterExplicitT<asmjit::v1_14::x86::Emitter> *local_618;
  uint32_t local_60c;
  undefined4 *local_608;
  FuncAttributes *local_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  FuncAttributes *local_5d8;
  FuncAttributes *local_5d0;
  FuncAttributes *local_5c8;
  undefined4 local_5bc;
  undefined4 local_5b8;
  FuncAttributes local_5b4;
  uint *local_5b0;
  undefined1 *local_5a8;
  undefined4 local_59c;
  undefined4 local_598;
  int local_594;
  uint *local_590;
  undefined1 *local_588;
  undefined4 local_57c;
  undefined4 local_578;
  FuncAttributes local_574;
  uint *local_570;
  uint *local_568;
  FuncAttributes *local_560;
  FuncAttributes *local_558;
  undefined1 *local_550;
  undefined1 local_541;
  undefined1 *local_540;
  undefined1 local_531;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined4 local_514;
  undefined4 *local_510;
  uint *local_500;
  char *local_4f8;
  long local_4f0;
  long local_4e8;
  uint *local_4e0;
  undefined4 *local_4d8;
  long local_4c8;
  FuncAttributes *local_4c0;
  FuncAttributes *local_4b8;
  FuncAttributes *local_4b0;
  FuncAttributes *local_4a8;
  undefined4 local_4a0;
  undefined4 local_49c;
  uint local_498;
  undefined4 local_494;
  undefined1 *local_490;
  undefined4 local_484;
  long local_480;
  FuncAttributes *local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 *local_468;
  undefined4 *local_460;
  undefined4 local_458;
  undefined4 local_454;
  FuncAttributes *local_450;
  undefined4 local_444;
  FuncAttributes *local_440;
  undefined4 local_434;
  FuncAttributes *local_430;
  undefined4 local_424;
  FuncAttributes *local_420;
  undefined4 local_414;
  FuncAttributes *local_410;
  undefined4 *local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  long local_3f8;
  long local_3f0;
  int local_3e4;
  FuncAttributes local_3e0;
  undefined4 local_3dc;
  undefined4 *local_3d8;
  undefined1 *local_3d0;
  undefined4 local_3c8;
  uint local_3c4;
  undefined4 local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  undefined4 local_3b0;
  FuncAttributes local_3ac;
  uint *local_3a8;
  uint *local_3a0;
  undefined4 local_394;
  uint *local_390;
  uint *local_388;
  uint *local_380;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 *local_370;
  uint *local_368;
  uint local_35c;
  undefined4 *local_358;
  uint *local_350;
  uint local_344;
  uint *local_340;
  undefined4 *local_338;
  uint local_32c;
  undefined4 local_328;
  uint local_324;
  undefined4 local_320;
  uint local_31c;
  uint local_318;
  uint local_314;
  undefined4 local_310;
  int local_30c;
  uint *local_308;
  undefined1 *local_300;
  undefined4 local_2f4;
  uint *local_2f0;
  uint *local_2e8;
  uint *local_2e0;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 *local_2d0;
  uint *local_2c8;
  uint local_2bc;
  undefined4 *local_2b8;
  uint *local_2b0;
  uint local_2a4;
  uint *local_2a0;
  undefined4 *local_298;
  uint local_28c;
  undefined4 local_288;
  uint local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  undefined4 local_270;
  FuncAttributes local_26c;
  uint *local_268;
  undefined1 *local_260;
  undefined4 local_254;
  uint *local_250;
  uint *local_248;
  uint *local_240;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 *local_230;
  uint *local_228;
  uint local_21c;
  undefined4 *local_218;
  uint *local_210;
  uint local_204;
  uint *local_200;
  undefined4 *local_1f8;
  uint local_1ec;
  byte local_1e5;
  uint local_1e4;
  byte local_1dd;
  uint local_1dc;
  byte local_1d5;
  uint local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  uint *local_1b8;
  uint *local_1b0;
  uint *local_1a8;
  FuncAttributes local_19c;
  undefined4 local_198;
  uint *local_190;
  undefined1 *local_188;
  FuncAttributes local_17c;
  undefined4 local_178;
  uint *local_170;
  undefined1 *local_168;
  int local_15c;
  undefined4 local_158;
  uint *local_150;
  undefined1 *local_148;
  int local_13c;
  undefined4 local_138;
  uint *local_130;
  undefined1 *local_128;
  FuncAttributes local_11c;
  undefined4 local_118;
  uint *local_110;
  uint *local_108;
  FuncAttributes local_fc;
  undefined4 local_f8;
  uint *local_f0;
  uint *local_e8;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 *local_b8;
  undefined4 *local_b0;
  byte *local_a8;
  byte local_9a;
  byte local_99;
  undefined4 *local_98;
  uint *local_90;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 *local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  long local_30;
  long local_28;
  undefined4 local_1c;
  uint local_18;
  undefined4 local_14;
  undefined4 *local_10;
  undefined4 *local_8;
  
  local_698 = *(long *)(in_RDI + 8);
  local_a8 = (byte *)(local_698 + 0x48);
  local_9a = *local_a8;
  local_6a4 = 8;
  if ((local_9a & 1) == 1) {
    local_6a4 = 4;
  }
  local_690 = in_RSI;
  local_678 = local_698;
  local_4f0 = local_698;
  local_4e8 = local_698;
  local_99 = local_9a;
  local_6a8 = FuncFrame::savedRegs
                        ((FuncFrame *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         (RegGroup)((uint)in_stack_fffffffffffff884 >> 0x18));
  EmitterExplicitT<asmjit::v1_14::x86::Emitter>::zsp
            ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)&local_6b8);
  EmitterExplicitT<asmjit::v1_14::x86::Emitter>::zbp
            ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)local_6c8);
  EmitterExplicitT<asmjit::v1_14::x86::Emitter>::zsp(local_6d8);
  local_650 = local_690;
  local_430 = local_690;
  local_434 = 0x10;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_690,kHasPreservedFP);
  if (bVar1) {
    local_6dc = 5;
    local_648 = &local_6dc;
    local_6a8 = local_6a8 & 0xffffffdf;
    local_408 = local_648;
  }
  local_558 = local_690;
  local_574 = local_690[0x18];
  local_568 = &local_6ec;
  local_570 = &local_6b8;
  local_578 = 0;
  local_57c = 0;
  local_394 = 0;
  local_3a0 = &local_6ec;
  local_3b0 = 0;
  local_378 = 2;
  local_374 = 2;
  local_3c0 = 2;
  local_1d5 = (byte)(local_6b8 >> 3) & 0x1f;
  local_3c4 = (uint)local_1d5 << 3;
  local_338 = &local_3c0;
  local_340 = &local_3c4;
  local_3bc = local_3c4 | 2;
  local_1c0 = 0;
  local_3c8 = 0;
  local_350 = &local_3bc;
  local_358 = &local_3c8;
  local_368 = &local_3b8;
  local_370 = &local_394;
  local_110 = &local_3b4;
  local_118 = 0;
  local_f8 = 0;
  local_6e8 = local_6b4;
  local_6e4 = 0;
  local_6f8 = &local_6f9;
  local_541 = 1;
  local_6fa = '\x01';
  local_531 = 4;
  local_6fb = '\x04';
  local_550 = local_6f8;
  local_540 = local_6f8;
  local_3b8 = local_3bc;
  local_3b4 = local_3bc;
  local_3ac = local_574;
  local_3a8 = local_570;
  local_390 = local_570;
  local_388 = local_570;
  local_380 = local_570;
  local_35c = local_3bc;
  local_344 = local_3bc;
  local_32c = local_3bc;
  local_1d4 = local_3c4;
  local_1bc = local_3c8;
  local_1a8 = local_570;
  local_11c = local_574;
  local_108 = local_3a0;
  local_fc = local_574;
  local_f0 = local_110;
  local_e8 = local_3a0;
  local_6ec = local_3bc;
  local_6e0 = local_574;
  while( true ) {
    local_528 = &local_6fa;
    local_530 = &local_6fb;
    if (local_6fa == local_6fb) break;
    local_520 = &local_6fa;
    local_6fc = local_6fa;
    local_63c = FuncFrame::savedRegs
                          ((FuncFrame *)
                           CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                           (RegGroup)((uint)in_stack_fffffffffffff884 >> 0x18));
    local_638 = &local_700;
    local_628 = &local_700;
    local_700 = local_63c;
    if (local_63c != 0) {
      local_510 = &local_710;
      local_514 = 1;
      local_d8 = &local_514;
      local_dc = 0xff;
      local_bc = 0xff;
      local_c0 = 0;
      local_c4 = 0;
      local_710 = 1;
      local_70c = 0xff;
      local_708 = 0;
      local_704 = 0;
      local_d0 = local_510;
      local_b8 = local_d8;
      local_b0 = local_510;
      EVar2 = X86Internal_setupSaveRestoreInfo
                        ((RegGroup)((uint)in_stack_fffffffffffff8cc >> 0x18),
                         in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                         in_stack_fffffffffffff8b0,
                         (uint32_t *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      if (EVar2 != 0) {
        return EVar2;
      }
      do {
        local_60c = Support::BitWordIterator<unsigned_int>::next
                              ((BitWordIterator<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        local_608 = &local_710;
        local_4c8 = local_698;
        local_4d8 = &local_710;
        local_4e0 = &local_6ec;
        local_98 = local_4d8;
        local_90 = local_4e0;
        local_70c = local_60c;
        EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                    in_stack_fffffffffffff88c,
                                    (Operand_ *)
                                    CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                                    (Operand_ *)
                                    CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (EVar2 != 0) {
          return EVar2;
        }
        local_500 = &local_6ec;
        local_6e0 = local_718 + local_6e0;
        local_630 = &local_700;
      } while (local_700 != 0);
    }
    local_4f8 = &local_6fa;
    local_6fa = local_6fa + '\x01';
  }
  local_4c0 = local_690;
  local_440 = local_690;
  local_444 = 0x40000;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_690,kX86_MMXCleanup);
  if ((bVar1) &&
     (EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::emms
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)), EVar2 != 0)
     ) {
    return EVar2;
  }
  local_4b8 = local_690;
  local_450 = local_690;
  local_454 = 0x80000;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_690,kX86_AVXCleanup);
  if ((bVar1) &&
     (EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::vzeroupper
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878)), EVar2 != 0)
     ) {
    return EVar2;
  }
  local_658 = local_690;
  local_420 = local_690;
  local_424 = 0x10;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_690,kHasPreservedFP);
  if (bVar1) {
    local_4b0 = local_690;
    iVar3 = (uint)(ushort)(short)local_690[0x16] - local_6a4;
    if (iVar3 == 0) {
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         (Gp *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                         (Gp *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    }
    else {
      local_594 = -iVar3;
      local_588 = &stack0xfffffffffffff8bc;
      local_590 = local_6c8;
      local_598 = 0;
      local_59c = 0;
      local_2f4 = 0;
      local_300 = &stack0xfffffffffffff8bc;
      local_310 = 0;
      local_2d8 = 2;
      local_2d4 = 2;
      local_320 = 2;
      local_1dd = (byte)(local_6c8[0] >> 3) & 0x1f;
      local_324 = (uint)local_1dd << 3;
      local_298 = &local_320;
      local_2a0 = &local_324;
      local_31c = local_324 | 2;
      local_1c8 = 0;
      local_328 = 0;
      local_2b0 = &local_31c;
      local_2b8 = &local_328;
      local_2c8 = &local_318;
      local_2d0 = &local_2f4;
      local_150 = &local_314;
      local_158 = 0;
      local_138 = 0;
      local_318 = local_31c;
      local_314 = local_31c;
      local_30c = local_594;
      local_308 = local_590;
      local_2f0 = local_590;
      local_2e8 = local_590;
      local_2e0 = local_590;
      local_2bc = local_31c;
      local_2a4 = local_31c;
      local_28c = local_31c;
      local_1dc = local_324;
      local_1c4 = local_328;
      local_1b0 = local_590;
      local_15c = local_594;
      local_148 = local_300;
      local_13c = local_594;
      local_130 = local_150;
      local_128 = local_300;
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::lea
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         (Gp *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                         (Mem *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    }
  }
  else {
    local_600 = local_690;
    if ((*(byte *)((long)local_690 + 0xd) < *(byte *)((long)local_690 + 10)) ||
       (local_5c8 = local_690, local_690[8] == ~kNoAttributes)) {
      local_5d8 = local_690;
      if (local_690[0xb] == kNoAttributes) goto LAB_001cf0b5;
      local_5d0 = local_690;
      local_3e0 = local_690[0xb];
      local_5e0 = &stack0xfffffffffffff894;
      local_5e8 = &stack0xfffffffffffff890;
      local_5ec = 0;
      local_470 = 4;
      local_46c = 4;
      local_5f4 = 4;
      local_400 = 0;
      local_5f8 = 0;
      local_460 = &local_5f4;
      local_468 = &local_5f8;
      local_5f0 = 4;
      local_3f8 = (long)(int)local_3e0;
      local_3f0 = (long)(int)local_3e0;
      local_3d8 = &local_5f0;
      local_3dc = 0;
      local_3e4 = (int)local_3e0 >> 0x1f;
      local_458 = local_5f0;
      local_3fc = local_5f8;
      local_3d0 = local_5e0;
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::add
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         (Gp *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                         (Imm *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    }
    else {
      local_560 = local_690;
      local_5b4 = local_690[8];
      local_5a8 = &stack0xfffffffffffff8ac;
      local_5b0 = &local_6b8;
      local_5b8 = 0;
      local_5bc = 0;
      local_254 = 0;
      local_260 = &stack0xfffffffffffff8ac;
      local_270 = 0;
      local_238 = 2;
      local_234 = 2;
      local_280 = 2;
      local_1e5 = (byte)(local_6b8 >> 3) & 0x1f;
      local_284 = (uint)local_1e5 << 3;
      local_1f8 = &local_280;
      local_200 = &local_284;
      local_27c = local_284 | 2;
      local_1d0 = 0;
      local_288 = 0;
      local_210 = &local_27c;
      local_218 = &local_288;
      local_228 = &local_278;
      local_230 = &local_254;
      local_190 = &local_274;
      local_198 = 0;
      local_178 = 0;
      local_278 = local_27c;
      local_274 = local_27c;
      local_26c = local_5b4;
      local_268 = local_5b0;
      local_250 = local_5b0;
      local_248 = local_5b0;
      local_240 = local_5b0;
      local_21c = local_27c;
      local_204 = local_27c;
      local_1ec = local_27c;
      local_1e4 = local_284;
      local_1cc = local_288;
      local_1b8 = local_5b0;
      local_19c = local_5b4;
      local_188 = local_260;
      local_17c = local_5b4;
      local_170 = local_190;
      local_168 = local_260;
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         (Gp *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                         (Mem *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    }
  }
  if (EVar2 != 0) {
    return EVar2;
  }
LAB_001cf0b5:
  if (local_6a8 != 0) {
    local_69c = local_6a8;
    local_6a0 = 0x10;
    do {
      local_6a0 = local_6a0 + -1;
      if ((local_69c & 0x8000) != 0) {
        local_618 = local_6d8;
        local_61c = local_6a0;
        local_6d4 = local_6a0;
        EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::pop
                          ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                           (Gp *)0x1cf143);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      local_69c = local_69c << 1;
    } while (local_6a0 != 0);
  }
  local_660 = local_690;
  local_410 = local_690;
  local_414 = 0x10;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_690,kHasPreservedFP);
  if ((!bVar1) ||
     (local_67c = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::pop
                            ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),
                             (Gp *)0x1cf1eb), local_67c == 0)) {
    local_4a8 = local_690;
    if (*(short *)((long)local_690 + 0xe) == 0) {
      local_668 = local_698;
      local_66c = 0x2b3;
      local_67c = BaseEmitter::_emitI((BaseEmitter *)
                                      CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                                      in_stack_fffffffffffff87c);
    }
    else {
      local_478 = local_690;
      local_18 = (uint)*(ushort *)((long)local_690 + 0xe);
      local_480 = local_698;
      local_484 = 0x2b3;
      local_490 = &stack0xfffffffffffff880;
      local_80 = &local_4a0;
      local_60 = &local_4a0;
      local_6c = 0;
      local_58 = 4;
      local_54 = 4;
      local_74 = 4;
      local_38 = 0;
      local_78 = 0;
      local_48 = &local_74;
      local_50 = &local_78;
      local_70 = 4;
      local_30 = (long)(int)local_18;
      local_28 = (long)(int)local_18;
      local_10 = &local_70;
      local_14 = 0;
      local_1c = 0;
      local_4a0 = 4;
      local_49c = 0;
      local_88 = local_490;
      local_68 = local_490;
      local_3c = local_70;
      local_34 = local_78;
      local_8 = local_60;
      local_498 = local_18;
      local_494 = local_1c;
      local_67c = BaseEmitter::_emitI((BaseEmitter *)CONCAT44(in_stack_fffffffffffff884,local_18),
                                      in_stack_fffffffffffff87c,(Operand_ *)0x1cf439);
    }
    if (local_67c == 0) {
      local_67c = 0;
    }
  }
  return local_67c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitEpilog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  uint32_t i;
  uint32_t regId;

  uint32_t registerSize = emitter->registerSize();
  uint32_t gpSaved = frame.savedRegs(RegGroup::kGp);

  Gp zsp = emitter->zsp();   // ESP|RSP register.
  Gp zbp = emitter->zbp();   // EBP|RBP register.
  Gp gpReg = emitter->zsp(); // General purpose register (temporary).

  // Don't emit 'pop zbp' in the pop sequence, this case is handled separately.
  if (frame.hasPreservedFP())
    gpSaved &= ~Support::bitMask(Gp::kIdBp);

  // Emit 'movxxx {[x|y|z]mm, k}, [zsp + X]'.
  {
    Mem xBase = ptr(zsp, int32_t(frame.extraRegSaveOffset()));

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup(1), RegGroup::kMaxVirt>{}) {
      Support::BitWordIterator<RegMask> it(frame.savedRegs(group));
      if (it.hasNext()) {
        Reg xReg;
        uint32_t xInst;
        uint32_t xSize;
        ASMJIT_PROPAGATE(X86Internal_setupSaveRestoreInfo(group, frame, xReg, xInst, xSize));
        do {
          xReg.setId(it.next());
          ASMJIT_PROPAGATE(emitter->emit(xInst, xReg, xBase));
          xBase.addOffsetLo32(int32_t(xSize));
        } while (it.hasNext());
      }
    }
  }

  // Emit 'emms' and/or 'vzeroupper'.
  if (frame.hasMmxCleanup()) ASMJIT_PROPAGATE(emitter->emms());
  if (frame.hasAvxCleanup()) ASMJIT_PROPAGATE(emitter->vzeroupper());

  if (frame.hasPreservedFP()) {
    // Emit 'mov zsp, zbp' or 'lea zsp, [zbp - x]'
    int32_t count = int32_t(frame.pushPopSaveSize() - registerSize);
    if (!count)
      ASMJIT_PROPAGATE(emitter->mov(zsp, zbp));
    else
      ASMJIT_PROPAGATE(emitter->lea(zsp, ptr(zbp, -count)));
  }
  else {
    if (frame.hasDynamicAlignment() && frame.hasDAOffset()) {
      // Emit 'mov zsp, [zsp + DsaSlot]'.
      Mem saMem = ptr(zsp, int32_t(frame.daOffset()));
      ASMJIT_PROPAGATE(emitter->mov(zsp, saMem));
    }
    else if (frame.hasStackAdjustment()) {
      // Emit 'add zsp, StackAdjustment'.
      ASMJIT_PROPAGATE(emitter->add(zsp, int32_t(frame.stackAdjustment())));
    }
  }

  // Emit 'pop gp' sequence.
  if (gpSaved) {
    i = gpSaved;
    regId = 16;

    do {
      regId--;
      if (i & 0x8000) {
        gpReg.setId(regId);
        ASMJIT_PROPAGATE(emitter->pop(gpReg));
      }
      i <<= 1;
    } while (regId != 0);
  }

  // Emit 'pop zbp'.
  if (frame.hasPreservedFP())
    ASMJIT_PROPAGATE(emitter->pop(zbp));

  // Emit 'ret' or 'ret x'.
  if (frame.hasCalleeStackCleanup())
    ASMJIT_PROPAGATE(emitter->emit(Inst::kIdRet, int(frame.calleeStackCleanup())));
  else
    ASMJIT_PROPAGATE(emitter->emit(Inst::kIdRet));

  return kErrorOk;
}